

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenRoomThreeAction.cpp
# Opt level: O2

ActionResults * __thiscall GreenRoomThreeAction::Use(GreenRoomThreeAction *this)

{
  ItemTable *pIVar1;
  itemLocation iVar2;
  itemLocation iVar3;
  itemType iVar4;
  ItemWrapper *pIVar5;
  ActionResults *pAVar6;
  string *this_00;
  itemType local_84;
  itemType local_80 [2];
  string local_78;
  string local_58;
  string local_38;
  
  pIVar1 = (this->super_AbstractRoomAction).itemList;
  local_84 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  pIVar5 = ItemTable::getValue(pIVar1,&local_84);
  iVar2 = ItemWrapper::getLocation(pIVar5);
  if (iVar2 != BACKPACK) {
    local_80[1] = 0;
    pIVar5 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_80 + 1);
    iVar2 = ItemWrapper::getLocation(pIVar5);
    pIVar1 = (this->super_AbstractRoomAction).itemList;
    local_80[0] = Command::getMainItem((this->super_AbstractRoomAction).commands);
    pIVar5 = ItemTable::getValue(pIVar1,local_80);
    iVar3 = ItemWrapper::getLocation(pIVar5);
    if (iVar2 != iVar3) {
      pAVar6 = (ActionResults *)operator_new(0x30);
      std::__cxx11::string::string((string *)&local_38,"No item to use here",(allocator *)&local_84)
      ;
      ActionResults::ActionResults(pAVar6,CURRENT,&local_38);
      this_00 = &local_38;
      goto LAB_0011dce7;
    }
  }
  iVar4 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (((iVar4 == BUCKET) &&
      (iVar4 = Command::getActedOnItem((this->super_AbstractRoomAction).commands), iVar4 == BASIN))
     || ((iVar4 = Command::getMainItem((this->super_AbstractRoomAction).commands), iVar4 == BASIN &&
         (iVar4 = Command::getActedOnItem((this->super_AbstractRoomAction).commands),
         iVar4 == BUCKET)))) {
    local_84 = BLOOD_BUCKET;
    pIVar5 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_84);
    ItemWrapper::setLocation(pIVar5,INACTIVE);
    local_84 = CLEAN_BUCKET;
    pIVar5 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_84);
    ItemWrapper::setLocation(pIVar5,ACTIVE);
    pAVar6 = (ActionResults *)operator_new(0x30);
    std::__cxx11::string::string
              ((string *)&local_58,
               "You cleaned the bloody bucket! You now have a clean bucket filled with water!",
               (allocator *)&local_84);
    ActionResults::ActionResults(pAVar6,CURRENT,&local_58);
    this_00 = &local_58;
  }
  else {
    iVar4 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (((iVar4 != BASIN) &&
        (iVar4 = Command::getActedOnItem((this->super_AbstractRoomAction).commands), iVar4 != BASIN)
        ) || ((iVar4 = Command::getMainItem((this->super_AbstractRoomAction).commands),
              iVar4 != CLEAN_BUCKET &&
              (iVar4 = Command::getActedOnItem((this->super_AbstractRoomAction).commands),
              iVar4 != CLEAN_BUCKET)))) {
      pAVar6 = AbstractRoomAction::Use(&this->super_AbstractRoomAction);
      return pAVar6;
    }
    pAVar6 = (ActionResults *)operator_new(0x30);
    std::__cxx11::string::string
              ((string *)&local_78,"You pour out and re-fill the bucket with ice-cold water",
               (allocator *)&local_84);
    ActionResults::ActionResults(pAVar6,CURRENT,&local_78);
    this_00 = &local_78;
  }
LAB_0011dce7:
  std::__cxx11::string::~string((string *)this_00);
  return pAVar6;
}

Assistant:

ActionResults *GreenRoomThreeAction::Use() {

    if(!(itemList->getValue(commands->getMainItem())->getLocation() == BACKPACK || itemList->getValue(PLAYER)->getLocation() == itemList->getValue(commands->getMainItem())->getLocation()))
    {
        return new ActionResults(CURRENT, "No item to use here");
    }

    if((commands->getMainItem() == BUCKET && commands->getActedOnItem() == BASIN) ||
            (commands->getMainItem() == BASIN && commands->getActedOnItem() == BUCKET)) {

        itemList->getValue(BLOOD_BUCKET)->setLocation(INACTIVE);
        itemList->getValue(CLEAN_BUCKET)->setLocation(ACTIVE);
        return new ActionResults(CURRENT, "You cleaned the bloody bucket! You now have a clean bucket filled with water!");
    }
    else if ((commands->getMainItem() == BASIN || commands->getActedOnItem() == BASIN) &&
                                                         (commands->getMainItem() == CLEAN_BUCKET || commands->getActedOnItem() == CLEAN_BUCKET))
    {
        return new ActionResults(CURRENT,"You pour out and re-fill the bucket with ice-cold water");
    } else {
        return AbstractRoomAction::Use();
    }
}